

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O3

Gia_Man_t * Gia_SweeperStart(Gia_Man_t *pGia)

{
  Vec_Int_t *p;
  int iVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  void *pvVar4;
  sat_solver *s;
  int Fill;
  long lVar5;
  timespec ts;
  uint local_34;
  timespec local_30;
  
  if (pGia == (Gia_Man_t *)0x0) {
    pGia = Gia_ManStart(10000);
  }
  if (pGia->pHTable == (int *)0x0) {
    Gia_ManHashStart(pGia);
    if (pGia->pHTable == (int *)0x0) {
      __assert_fail("pGia->pHTable != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweeper.c"
                    ,0x6f,"Swp_Man_t *Swp_ManStart(Gia_Man_t *)");
    }
  }
  puVar2 = (undefined8 *)calloc(1,0xa8);
  pGia->pData = puVar2;
  *puVar2 = pGia;
  *(undefined4 *)(puVar2 + 1) = 1000;
  puVar3 = (undefined8 *)malloc(0x10);
  *puVar3 = 100;
  pvVar4 = malloc(400);
  puVar3[1] = pvVar4;
  puVar2[2] = puVar3;
  puVar3 = (undefined8 *)malloc(0x10);
  *puVar3 = 100;
  pvVar4 = malloc(400);
  puVar3[1] = pvVar4;
  puVar2[3] = puVar3;
  puVar3 = (undefined8 *)malloc(0x10);
  *puVar3 = 100;
  pvVar4 = malloc(400);
  puVar3[1] = pvVar4;
  puVar2[4] = puVar3;
  puVar3 = (undefined8 *)malloc(0x10);
  *puVar3 = 10000;
  pvVar4 = malloc(40000);
  puVar3[1] = pvVar4;
  puVar2[6] = puVar3;
  puVar3 = (undefined8 *)malloc(0x10);
  *puVar3 = 100;
  pvVar4 = malloc(400);
  puVar3[1] = pvVar4;
  puVar2[7] = puVar3;
  puVar3 = (undefined8 *)malloc(0x10);
  *puVar3 = 100;
  pvVar4 = malloc(400);
  puVar3[1] = pvVar4;
  puVar2[8] = puVar3;
  puVar3 = (undefined8 *)malloc(0x10);
  *puVar3 = 100;
  pvVar4 = malloc(400);
  puVar3[1] = pvVar4;
  puVar2[9] = puVar3;
  s = sat_solver_new();
  puVar2[5] = s;
  *(undefined4 *)(puVar2 + 0xb) = 1;
  sat_solver_setnvars(s,1000);
  iVar1 = *(int *)(puVar2 + 0xb);
  *(int *)(puVar2 + 0xb) = iVar1 + 1;
  if (iVar1 < 0) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10b,"int Abc_Var2Lit(int, int)");
  }
  if (iVar1 == 0) {
    __assert_fail("Lit > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweeper.c"
                  ,0x5a,"void Swp_ManSetObj2Lit(Swp_Man_t *, int, int)");
  }
  p = (Vec_Int_t *)puVar2[6];
  Vec_IntFillExtra(p,1,Fill);
  if (0 < p->nSize) {
    *p->pArray = iVar1 * 2;
    local_34 = iVar1 * 2 | 1;
    sat_solver_addclause((sat_solver *)puVar2[5],(lit *)&local_34,(lit *)&local_30);
    iVar1 = clock_gettime(3,&local_30);
    if (iVar1 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    puVar2[0xe] = lVar5;
    pGia->fSweeper = 1;
    return pGia;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

Gia_Man_t * Gia_SweeperStart( Gia_Man_t * pGia )
{
    if ( pGia == NULL )
        pGia = Gia_ManStart( 10000 );
    if ( pGia->pHTable == NULL )
        Gia_ManHashStart( pGia );
    // recompute fPhase and fMark1 to mark multiple fanout nodes if AIG is already defined!!!

    Swp_ManStart( pGia );
    pGia->fSweeper = 1;
    return pGia;
}